

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O3

void jpeg_calc_output_dimensions(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_component_info *pjVar3;
  int iVar4;
  uint uVar5;
  boolean bVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  jpeg_component_info *pjVar13;
  JDIMENSION *pJVar14;
  int iVar15;
  
  iVar10 = cinfo->global_state;
  if (iVar10 != 0xca) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  jpeg_core_output_dimensions(cinfo);
  iVar10 = cinfo->num_components;
  if (0 < iVar10) {
    pjVar3 = cinfo->comp_info;
    iVar9 = cinfo->min_DCT_h_scaled_size;
    iVar1 = cinfo->min_DCT_v_scaled_size;
    iVar11 = (uint)(cinfo->do_fancy_upsampling != 0) * 4 + 4;
    iVar12 = 0;
    pjVar13 = pjVar3;
    do {
      iVar8 = iVar9;
      if (iVar9 <= iVar11) {
        iVar4 = 1;
        do {
          if (cinfo->max_h_samp_factor % (iVar4 * pjVar13->h_samp_factor * 2) != 0) {
            iVar8 = iVar4 * iVar9;
            break;
          }
          iVar4 = iVar4 * 2;
          iVar8 = iVar9 * iVar4;
        } while (iVar8 <= iVar11);
      }
      pjVar13->DCT_h_scaled_size = iVar8;
      iVar4 = iVar1;
      if (iVar1 <= iVar11) {
        iVar15 = 1;
        do {
          if (cinfo->max_v_samp_factor % (iVar15 * pjVar13->v_samp_factor * 2) != 0) {
            iVar4 = iVar15 * iVar1;
            break;
          }
          iVar15 = iVar15 * 2;
          iVar4 = iVar1 * iVar15;
        } while (iVar4 <= iVar11);
      }
      pjVar13->DCT_v_scaled_size = iVar4;
      iVar15 = iVar4 * 2;
      if (iVar8 == iVar15 || SBORROW4(iVar8,iVar15) != iVar8 + iVar4 * -2 < 0) {
        if (iVar8 * 2 < iVar4) {
          pjVar13->DCT_v_scaled_size = iVar8 * 2;
        }
      }
      else {
        pjVar13->DCT_h_scaled_size = iVar15;
      }
      iVar12 = iVar12 + 1;
      pjVar13 = pjVar13 + 1;
    } while (iVar12 != iVar10);
    if (0 < iVar10) {
      pJVar14 = &pjVar3->downsampled_height;
      iVar9 = 0;
      do {
        lVar7 = jdiv_round_up((long)(int)pJVar14[-3] * (long)(int)pJVar14[-10] *
                              (ulong)cinfo->image_width,
                              (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
        pJVar14[-1] = (JDIMENSION)lVar7;
        lVar7 = jdiv_round_up((long)(int)pJVar14[-2] * (long)(int)pJVar14[-9] *
                              (ulong)cinfo->image_height,
                              (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
        *pJVar14 = (JDIMENSION)lVar7;
        iVar9 = iVar9 + 1;
        iVar10 = cinfo->num_components;
        pJVar14 = pJVar14 + 0x18;
      } while (iVar9 < iVar10);
    }
  }
  uVar5 = cinfo->out_color_space - JCS_GRAYSCALE;
  if (uVar5 < 5) {
    iVar10 = *(int *)(&DAT_0031002c + (ulong)uVar5 * 4);
  }
  cinfo->out_color_components = iVar10;
  iVar9 = 1;
  if (cinfo->quantize_colors != 0) {
    iVar10 = 1;
  }
  cinfo->output_components = iVar10;
  bVar6 = use_merged_upsample(cinfo);
  if (bVar6 != 0) {
    iVar9 = cinfo->max_v_samp_factor;
  }
  cinfo->rec_outbuf_height = iVar9;
  return;
}

Assistant:

GLOBAL(void)
jpeg_calc_output_dimensions (j_decompress_ptr cinfo)
/* Do computations that are needed before master selection phase.
 * This function is used for full decompression.
 */
{
#ifdef IDCT_SCALING_SUPPORTED
  int ci;
  jpeg_component_info *compptr;
#endif

  /* Prevent application from calling me at wrong times */
  if (cinfo->global_state != DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Compute core output image dimensions and DCT scaling choices. */
  jpeg_core_output_dimensions(cinfo);

#ifdef IDCT_SCALING_SUPPORTED

  /* In selecting the actual DCT scaling for each component, we try to
   * scale up the chroma components via IDCT scaling rather than upsampling.
   * This saves time if the upsampler gets to use 1:1 scaling.
   * Note this code adapts subsampling ratios which are powers of 2.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int ssize = 1;
    while (cinfo->min_DCT_h_scaled_size * ssize <=
	   (cinfo->do_fancy_upsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_h_samp_factor % (compptr->h_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
    compptr->DCT_h_scaled_size = cinfo->min_DCT_h_scaled_size * ssize;
    ssize = 1;
    while (cinfo->min_DCT_v_scaled_size * ssize <=
	   (cinfo->do_fancy_upsampling ? DCTSIZE : DCTSIZE / 2) &&
	   (cinfo->max_v_samp_factor % (compptr->v_samp_factor * ssize * 2)) == 0) {
      ssize = ssize * 2;
    }
    compptr->DCT_v_scaled_size = cinfo->min_DCT_v_scaled_size * ssize;

    /* We don't support IDCT ratios larger than 2. */
    if (compptr->DCT_h_scaled_size > compptr->DCT_v_scaled_size * 2)
	compptr->DCT_h_scaled_size = compptr->DCT_v_scaled_size * 2;
    else if (compptr->DCT_v_scaled_size > compptr->DCT_h_scaled_size * 2)
	compptr->DCT_v_scaled_size = compptr->DCT_h_scaled_size * 2;
  }

  /* Recompute downsampled dimensions of components;
   * application needs to know these if using raw downsampled data.
   */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Size in samples, after IDCT scaling */
    compptr->downsampled_width = (JDIMENSION)
      jdiv_round_up((long) cinfo->image_width *
		    (long) (compptr->h_samp_factor * compptr->DCT_h_scaled_size),
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    compptr->downsampled_height = (JDIMENSION)
      jdiv_round_up((long) cinfo->image_height *
		    (long) (compptr->v_samp_factor * compptr->DCT_v_scaled_size),
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
  }

#endif /* IDCT_SCALING_SUPPORTED */

  /* Report number of components in selected colorspace. */
  /* Probably this should be in the color conversion module... */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    cinfo->out_color_components = 1;
    break;
  case JCS_RGB:
    cinfo->out_color_components = RGB_PIXELSIZE;
    break;
  case JCS_YCbCr:
    cinfo->out_color_components = 3;
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    cinfo->out_color_components = 4;
    break;
  default:			/* else must be same colorspace as in file */
    cinfo->out_color_components = cinfo->num_components;
    break;
  }
  cinfo->output_components = (cinfo->quantize_colors ? 1 :
			      cinfo->out_color_components);

  /* See if upsampler will want to emit more than one row at a time */
  if (use_merged_upsample(cinfo))
    cinfo->rec_outbuf_height = cinfo->max_v_samp_factor;
  else
    cinfo->rec_outbuf_height = 1;
}